

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::ShapeIntersection::ToString_abi_cxx11_(ShapeIntersection *this)

{
  string *in_RDI;
  SurfaceInteraction *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::SurfaceInteraction_const&,float_const&>
            (in_stack_00000018,in_stack_00000010,(float *)this);
  return in_RDI;
}

Assistant:

std::string ShapeIntersection::ToString() const {
    return StringPrintf("[ ShapeIntersection intr: %s tHit: %f ]", intr, tHit);
}